

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O3

void __thiscall CUI::UpdateClipping(CUI *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  IGraphics *pIVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  
  if (this->m_NumClips != 0) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/game/client/ui.cpp"
                   ,0xca,1,"no clip region");
    uVar4 = this->m_NumClips - 1;
    pIVar3 = this->m_pGraphics;
    uVar1 = pIVar3->m_ScreenWidth;
    uVar2 = pIVar3->m_ScreenHeight;
    fVar6 = ((float)(int)uVar1 / (float)(int)uVar2) * 600.0;
    fVar5 = (float)(int)uVar1 / fVar6;
    (this->m_Screen).h = 600.0;
    (this->m_Screen).w = fVar6;
    fVar6 = (float)(int)uVar2 / 600.0;
    (*(pIVar3->super_IInterface)._vptr_IInterface[3])
              (pIVar3,(ulong)(uint)(int)(this->m_aClips[uVar4].x * fVar5),
               (ulong)(uint)(int)(this->m_aClips[uVar4].y * fVar6),
               (ulong)(uint)(int)(fVar5 * this->m_aClips[uVar4].w),
               (ulong)(uint)(int)(fVar6 * this->m_aClips[uVar4].h));
    return;
  }
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[4])();
  return;
}

Assistant:

void CUI::UpdateClipping()
{
	if(IsClipped())
	{
		const CUIRect *pRect = ClipArea();
		const float XScale = Graphics()->ScreenWidth()/Screen()->w;
		const float YScale = Graphics()->ScreenHeight()/Screen()->h;
		Graphics()->ClipEnable((int)(pRect->x*XScale), (int)(pRect->y*YScale), (int)(pRect->w*XScale), (int)(pRect->h*YScale));
	}
	else
	{
		Graphics()->ClipDisable();
	}
}